

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# product_factory.h
# Opt level: O0

void ProductRegistry::AddCreator(string *type,Creator creator)

{
  CreatorRegistry *this;
  size_type sVar1;
  ostream *poVar2;
  mapped_type *pp_Var3;
  CreatorRegistry *registry;
  Creator creator_local;
  string *type_local;
  
  this = Registry_abi_cxx11_();
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Shoes>_(*)(const_ShoesParameter_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Shoes>_(*)(const_ShoesParameter_&)>_>_>
          ::count(this,type);
  if (sVar1 == 1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Shoes type ");
    poVar2 = std::operator<<(poVar2,(string *)type);
    poVar2 = std::operator<<(poVar2," already registered.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  pp_Var3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Shoes>_(*)(const_ShoesParameter_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Shoes>_(*)(const_ShoesParameter_&)>_>_>
            ::operator[](this,type);
  *pp_Var3 = creator;
  return;
}

Assistant:

static void AddCreator(const string &type, Creator creator) {
        CreatorRegistry &registry = Registry();
        if (registry.count(type) == 1) {
            cout << "Shoes type " << type << " already registered."<<endl;
        }
        registry[type] = creator;
    }